

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O3

int mbedtls_net_send(void *ctx,uchar *buf,size_t len)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  
  if (*ctx < 0) {
    iVar2 = -0x45;
  }
  else {
    sVar4 = write(*ctx,buf,len);
    iVar2 = (int)sVar4;
    if (iVar2 < 0) {
      iVar2 = *ctx;
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      uVar3 = fcntl(iVar2,3);
      *piVar5 = iVar1;
      iVar2 = -0x6880;
      if (((iVar1 != 0xb || (uVar3 >> 0xb & 1) == 0) && (iVar2 = -0x50, iVar1 != 0x68)) &&
         (iVar1 != 0x20)) {
        if (iVar1 == 4) {
          iVar2 = -0x6880;
        }
        else {
          iVar2 = -0x4e;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_net_send( void *ctx, const unsigned char *buf, size_t len )
{
    int ret;
    int fd = ((mbedtls_net_context *) ctx)->fd;

    if( fd < 0 )
        return( MBEDTLS_ERR_NET_INVALID_CONTEXT );

    ret = (int) write( fd, buf, len );

    if( ret < 0 )
    {
        if( net_would_block( ctx ) != 0 )
            return( MBEDTLS_ERR_SSL_WANT_WRITE );

#if ( defined(_WIN32) || defined(_WIN32_WCE) ) && !defined(EFIX64) && \
    !defined(EFI32)
        if( WSAGetLastError() == WSAECONNRESET )
            return( MBEDTLS_ERR_NET_CONN_RESET );
#else
        if( errno == EPIPE || errno == ECONNRESET )
            return( MBEDTLS_ERR_NET_CONN_RESET );

        if( errno == EINTR )
            return( MBEDTLS_ERR_SSL_WANT_WRITE );
#endif

        return( MBEDTLS_ERR_NET_SEND_FAILED );
    }

    return( ret );
}